

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

vw * setup(options_i *options)

{
  _func_int *p_Var1;
  int iVar2;
  vw *pvVar3;
  ostream *poVar4;
  allocator local_51;
  string local_50 [32];
  
  pvVar3 = VW::initialize(options,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  pvVar3->vw_is_main = true;
  if (((pvVar3->quiet == false) && (pvVar3->bfgs == false)) && (pvVar3->searchstr == (void *)0x0)) {
    std::__cxx11::string::string(local_50,"audit_regressor",&local_51);
    iVar2 = (*options->_vptr_options_i[1])(options,local_50);
    std::__cxx11::string::~string(local_50);
    if ((char)iVar2 == '\0') {
      p_Var1 = (pvVar3->trace_message).super_ostream._vptr_basic_ostream[-3];
      *(uint *)(p_Var1 + 0x18 + (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) =
           *(uint *)(p_Var1 + 0x18 +
                    (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) & 0xffffff4f |
           0x20;
      *(undefined8 *)
       ((pvVar3->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
       (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) = 8;
      p_Var1 = (pvVar3->trace_message).super_ostream._vptr_basic_ostream[-3];
      *(uint *)(p_Var1 + 0x18 + (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) =
           *(uint *)(p_Var1 + 0x18 +
                    (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) & 0xffffff4f |
           0x20;
      poVar4 = std::operator<<(&(pvVar3->trace_message).super_ostream,"average");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 8;
      *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffff4f |
           0x20;
      poVar4 = std::operator<<(poVar4,"since");
      poVar4 = std::operator<<(poVar4," ");
      *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffff4f |
           0x80;
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 0xc;
      poVar4 = std::operator<<(poVar4,"example");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 0xe;
      poVar4 = std::operator<<(poVar4,"example");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 8;
      poVar4 = std::operator<<(poVar4,"current");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 8;
      poVar4 = std::operator<<(poVar4,"current");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 8;
      poVar4 = std::operator<<(poVar4,"current");
      std::endl<char,std::char_traits<char>>(poVar4);
      p_Var1 = (pvVar3->trace_message).super_ostream._vptr_basic_ostream[-3];
      *(uint *)(p_Var1 + 0x18 + (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) =
           *(uint *)(p_Var1 + 0x18 +
                    (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) & 0xffffff4f |
           0x20;
      *(undefined8 *)
       ((pvVar3->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
       (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) = 8;
      p_Var1 = (pvVar3->trace_message).super_ostream._vptr_basic_ostream[-3];
      *(uint *)(p_Var1 + 0x18 + (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) =
           *(uint *)(p_Var1 + 0x18 +
                    (long)&(pvVar3->trace_message).super_ostream._vptr_basic_ostream) & 0xffffff4f |
           0x20;
      poVar4 = std::operator<<(&(pvVar3->trace_message).super_ostream,"loss");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 8;
      *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffff4f |
           0x20;
      poVar4 = std::operator<<(poVar4,"last");
      poVar4 = std::operator<<(poVar4," ");
      *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar4->field_0x18 + (long)poVar4->_vptr_basic_ostream[-3]) & 0xffffff4f |
           0x80;
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 0xc;
      poVar4 = std::operator<<(poVar4,"counter");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 0xe;
      poVar4 = std::operator<<(poVar4,"weight");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 8;
      poVar4 = std::operator<<(poVar4,"label");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 8;
      poVar4 = std::operator<<(poVar4,"predict");
      poVar4 = std::operator<<(poVar4," ");
      *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 8;
      poVar4 = std::operator<<(poVar4,"features");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  return pvVar3;
}

Assistant:

vw* setup(options_i& options)
{
  vw* all = nullptr;
  try
  {
    all = VW::initialize(options);
  }
  catch (const exception& ex)
  {
    cout << ex.what() << endl;
    throw;
  }
  catch (...)
  {
    cout << "unknown exception" << endl;
    throw;
  }
  all->vw_is_main = true;

  if (!all->quiet && !all->bfgs && !all->searchstr && !options.was_supplied("audit_regressor"))
  {
    all->trace_message << std::left << std::setw(shared_data::col_avg_loss) << std::left << "average"
                       << " " << std::setw(shared_data::col_since_last) << std::left << "since"
                       << " " << std::right << std::setw(shared_data::col_example_counter) << "example"
                       << " " << std::setw(shared_data::col_example_weight) << "example"
                       << " " << std::setw(shared_data::col_current_label) << "current"
                       << " " << std::setw(shared_data::col_current_predict) << "current"
                       << " " << std::setw(shared_data::col_current_features) << "current" << std::endl;
    all->trace_message << std::left << std::setw(shared_data::col_avg_loss) << std::left << "loss"
                       << " " << std::setw(shared_data::col_since_last) << std::left << "last"
                       << " " << std::right << std::setw(shared_data::col_example_counter) << "counter"
                       << " " << std::setw(shared_data::col_example_weight) << "weight"
                       << " " << std::setw(shared_data::col_current_label) << "label"
                       << " " << std::setw(shared_data::col_current_predict) << "predict"
                       << " " << std::setw(shared_data::col_current_features) << "features" << std::endl;
  }

  return all;
}